

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

void __thiscall
icu_63::VTimeZone::writeZonePropsByDOW_GEQ_DOM
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,UDate startTime,
          UDate untilTime,UErrorCode *status)

{
  int iVar1;
  uint uVar2;
  int32_t iVar3;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (dayOfMonth % 7 == 1) {
    iVar1 = (int)((ulong)((long)(dayOfMonth + 6) * -0x6db6db6d) >> 0x20) + dayOfMonth + 6;
    iVar1 = (iVar1 >> 2) - (iVar1 >> 0x1f);
  }
  else {
    if ((month == 1) ||
       (uVar2 = *(int *)(MONTHLENGTH + (long)month * 4) - dayOfMonth, (int)uVar2 % 7 != 6)) {
      beginZoneProps(this,writer,isDst,zonename,fromOffset,toOffset,startTime,status);
      if (U_ZERO_ERROR < *status) {
        return;
      }
      if (dayOfMonth < 1) {
        iVar3 = 0xb;
        if (0 < month) {
          iVar3 = month + -1;
        }
        writeZonePropsByDOW_GEQ_DOM_sub
                  (this,writer,iVar3,dayOfMonth + -1,dayOfWeek,1 - dayOfMonth,1.838821689216e+17,
                   fromOffset,status);
        if (U_ZERO_ERROR < *status) {
          return;
        }
        iVar1 = dayOfMonth + 6;
        dayOfMonth = 1;
      }
      else {
        iVar1 = 7;
        uVar2 = (dayOfMonth + 6) - *(int *)(MONTHLENGTH + (long)month * 4);
        this = (VTimeZone *)(ulong)uVar2;
        if (uVar2 != 0 && *(int *)(MONTHLENGTH + (long)month * 4) <= dayOfMonth + 6) {
          iVar3 = 0;
          if (month < 0xb) {
            iVar3 = month + 1;
          }
          writeZonePropsByDOW_GEQ_DOM_sub
                    (this,writer,iVar3,1,dayOfWeek,uVar2,1.838821689216e+17,fromOffset,status);
          if (U_ZERO_ERROR < *status) {
            return;
          }
          iVar1 = 7 - uVar2;
        }
      }
      writeZonePropsByDOW_GEQ_DOM_sub
                (this,writer,month,dayOfMonth,dayOfWeek,iVar1,untilTime,fromOffset,status);
      if (U_ZERO_ERROR < *status) {
        return;
      }
      endZoneProps(this,writer,isDst,status);
      return;
    }
    iVar1 = (int)((ulong)((long)(int)(uVar2 + 1) * 0x6db6db6d) >> 0x20) + ~uVar2;
    iVar1 = (iVar1 >> 2) - (iVar1 >> 0x1f);
  }
  writeZonePropsByDOW(this,writer,isDst,zonename,fromOffset,toOffset,month,iVar1,dayOfWeek,startTime
                      ,untilTime,status);
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByDOW_GEQ_DOM(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                                       int32_t fromOffset, int32_t toOffset,
                                       int32_t month, int32_t dayOfMonth, int32_t dayOfWeek,
                                       UDate startTime, UDate untilTime, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    // Check if this rule can be converted to DOW rule
    if (dayOfMonth%7 == 1) {
        // Can be represented by DOW rule
        writeZonePropsByDOW(writer, isDst, zonename, fromOffset, toOffset,
                month, (dayOfMonth + 6)/7, dayOfWeek, startTime, untilTime, status);
        if (U_FAILURE(status)) {
            return;
        }
    } else if (month != UCAL_FEBRUARY && (MONTHLENGTH[month] - dayOfMonth)%7 == 6) {
        // Can be represented by DOW rule with negative week number
        writeZonePropsByDOW(writer, isDst, zonename, fromOffset, toOffset,
                month, -1*((MONTHLENGTH[month] - dayOfMonth + 1)/7), dayOfWeek, startTime, untilTime, status);
        if (U_FAILURE(status)) {
            return;
        }
    } else {
        // Otherwise, use BYMONTHDAY to include all possible dates
        beginZoneProps(writer, isDst, zonename, fromOffset, toOffset, startTime, status);
        if (U_FAILURE(status)) {
            return;
        }
        // Check if all days are in the same month
        int32_t startDay = dayOfMonth;
        int32_t currentMonthDays = 7;
    
        if (dayOfMonth <= 0) {
            // The start day is in previous month
            int32_t prevMonthDays = 1 - dayOfMonth;
            currentMonthDays -= prevMonthDays;

            int32_t prevMonth = (month - 1) < 0 ? 11 : month - 1;

            // Note: When a rule is separated into two, UNTIL attribute needs to be
            // calculated for each of them.  For now, we skip this, because we basically use this method
            // only for final rules, which does not have the UNTIL attribute
            writeZonePropsByDOW_GEQ_DOM_sub(writer, prevMonth, -prevMonthDays, dayOfWeek, prevMonthDays,
                MAX_MILLIS /* Do not use UNTIL */, fromOffset, status);
            if (U_FAILURE(status)) {
                return;
            }

            // Start from 1 for the rest
            startDay = 1;
        } else if (dayOfMonth + 6 > MONTHLENGTH[month]) {
            // Note: This code does not actually work well in February.  For now, days in month in
            // non-leap year.
            int32_t nextMonthDays = dayOfMonth + 6 - MONTHLENGTH[month];
            currentMonthDays -= nextMonthDays;

            int32_t nextMonth = (month + 1) > 11 ? 0 : month + 1;
            
            writeZonePropsByDOW_GEQ_DOM_sub(writer, nextMonth, 1, dayOfWeek, nextMonthDays,
                MAX_MILLIS /* Do not use UNTIL */, fromOffset, status);
            if (U_FAILURE(status)) {
                return;
            }
        }
        writeZonePropsByDOW_GEQ_DOM_sub(writer, month, startDay, dayOfWeek, currentMonthDays,
            untilTime, fromOffset, status);
        if (U_FAILURE(status)) {
            return;
        }
        endZoneProps(writer, isDst, status);
    }
}